

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O3

void __thiscall qpdf::pl::Count::~Count(Count *this)

{
  ~Count(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

void
        write(unsigned char const* buf, size_t len) final
        {
            if (len) {
                if (str) {
                    str->append(reinterpret_cast<char const*>(buf), len);
                    return;
                }
                count += static_cast<qpdf_offset_t>(len);
                if (pass_immediately_to_next) {
                    next()->write(buf, len);
                }
            }
        }